

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_adpcm.cpp
# Opt level: O0

clock_t __thiscall ymfm::adpcm_b_channel::clock(adpcm_b_channel *this)

{
  int iVar1;
  byte bVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  int32_t iVar6;
  ymfm_interface *this_00;
  clock_t extraout_RAX;
  uint uVar7;
  uint local_1c;
  int32_t delta;
  uint8_t data;
  uint32_t position;
  adpcm_b_channel *this_local;
  
  uVar4 = adpcm_b_registers::execute(this->m_regs);
  if (((uVar4 == 0) || (uVar4 = adpcm_b_registers::record(this->m_regs), uVar4 != 0)) ||
     ((this->m_status & 4) == 0)) {
    this->m_status = this->m_status & 0xfffffffb;
  }
  else {
    uVar4 = this->m_position;
    uVar5 = adpcm_b_registers::delta_n(this->m_regs);
    uVar7 = uVar4 + uVar5;
    this->m_position = uVar7 & 0xffff;
    if (0xffff < uVar7) {
      if ((this->m_curnibble == 0) &&
         (uVar4 = adpcm_b_registers::external(this->m_regs), uVar4 != 0)) {
        this_00 = adpcm_b_engine::intf(this->m_owner);
        bVar2 = ymfm_interface::ymfm_external_read(this_00,ACCESS_ADPCM_B,this->m_curaddress);
        this->m_curbyte = (uint)bVar2;
      }
      uVar4 = (int)(this->m_curbyte << ((byte)(this->m_curnibble << 2) & 0x1f) & 0xff) >> 4;
      this->m_curnibble = this->m_curnibble ^ 1;
      if (this->m_curnibble == 0) {
        uVar5 = adpcm_b_registers::external(this->m_regs);
        if (uVar5 == 0) {
          uVar5 = adpcm_b_registers::cpudata(this->m_regs);
          this->m_curbyte = uVar5;
          this->m_status = this->m_status | 2;
        }
        else {
          bVar3 = at_end(this);
          if (bVar3) {
            uVar5 = adpcm_b_registers::repeat(this->m_regs);
            if (uVar5 == 0) {
              this->m_accumulator = 0;
              this->m_prev_accum = 0;
              this->m_status = this->m_status & 0xfffffffb | 1;
              debug::log_keyon<char_const(&)[4],char_const(&)[10]>
                        ((char (*) [4])0x24e50d,(char (*) [10])"ADPCM EOS");
              return extraout_RAX;
            }
            load_start(this);
          }
          else {
            bVar3 = at_limit(this);
            if (bVar3) {
              this->m_curaddress = 0;
            }
            else {
              this->m_curaddress = this->m_curaddress + 1;
              this->m_curaddress = this->m_curaddress & 0xffffff;
            }
          }
        }
      }
      this->m_prev_accum = this->m_accumulator;
      uVar5 = bitfield(uVar4,0,3);
      local_1c = (uVar5 * 2 + 1) * this->m_adpcm_step >> 3;
      uVar5 = bitfield(uVar4,3,1);
      if (uVar5 != 0) {
        local_1c = -local_1c;
      }
      iVar6 = clamp(this->m_accumulator + local_1c,-0x8000,0x7fff);
      this->m_accumulator = iVar6;
      iVar1 = this->m_adpcm_step;
      uVar4 = bitfield(uVar4,0,3);
      iVar6 = clamp((int)(iVar1 * (uint)clock::s_step_scale[uVar4]) / 0x40,0x7f,0x6000);
      this->m_adpcm_step = iVar6;
    }
  }
  return (clock_t)this;
}

Assistant:

void adpcm_b_channel::clock()
{
	// only process if active and not recording (which we don't support)
	if (!m_regs.execute() || m_regs.record() || (m_status & STATUS_PLAYING) == 0)
	{
		m_status &= ~STATUS_PLAYING;
		return;
	}

	// otherwise, advance the step
	uint32_t position = m_position + m_regs.delta_n();
	m_position = uint16_t(position);
	if (position < 0x10000)
		return;

	// if we're about to process nibble 0, fetch sample
	if (m_curnibble == 0)
	{
		// playing from RAM/ROM
		if (m_regs.external())
			m_curbyte = m_owner.intf().ymfm_external_read(ACCESS_ADPCM_B, m_curaddress);
	}

	// extract the nibble from our current byte
	uint8_t data = uint8_t(m_curbyte << (4 * m_curnibble)) >> 4;
	m_curnibble ^= 1;

	// we just processed the last nibble
	if (m_curnibble == 0)
	{
		// if playing from RAM/ROM, check the end/limit address or advance
		if (m_regs.external())
		{
			// handle the sample end, either repeating or stopping
			if (at_end())
			{
				// if repeating, go back to the start
				if (m_regs.repeat())
					load_start();

				// otherwise, done; set the EOS bit
				else
				{
					m_accumulator = 0;
					m_prev_accum = 0;
					m_status = (m_status & ~STATUS_PLAYING) | STATUS_EOS;
					debug::log_keyon("%s\n", "ADPCM EOS");
					return;
				}
			}

			// wrap at the limit address
			else if (at_limit())
				m_curaddress = 0;

			// otherwise, advance the current address
			else
			{
				m_curaddress++;
				m_curaddress &= 0xffffff;
			}
		}

		// if CPU-driven, copy the next byte and request more
		else
		{
			m_curbyte = m_regs.cpudata();
			m_status |= STATUS_BRDY;
		}
	}

	// remember previous value for interpolation
	m_prev_accum = m_accumulator;

	// forecast to next forecast: 1/8, 3/8, 5/8, 7/8, 9/8, 11/8, 13/8, 15/8
	int32_t delta = (2 * bitfield(data, 0, 3) + 1) * m_adpcm_step / 8;
	if (bitfield(data, 3))
		delta = -delta;

	// add and clamp to 16 bits
	m_accumulator = clamp(m_accumulator + delta, -32768, 32767);

	// scale the ADPCM step: 0.9, 0.9, 0.9, 0.9, 1.2, 1.6, 2.0, 2.4
	static uint8_t const s_step_scale[8] = { 57, 57, 57, 57, 77, 102, 128, 153 };
	m_adpcm_step = clamp((m_adpcm_step * s_step_scale[bitfield(data, 0, 3)]) / 64, STEP_MIN, STEP_MAX);
}